

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.h
# Opt level: O3

CCharmapToLocal * __thiscall CVmObjCharSet::get_to_local(CVmObjCharSet *this)

{
  CCharmapToLocal *pCVar1;
  
  pCVar1 = *(CCharmapToLocal **)(this->super_CVmObject).ext_;
  if (pCVar1 != (CCharmapToLocal *)0x0) {
    return pCVar1;
  }
  CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.charset_unknown_exc,0,"unknown character set")
  ;
}

Assistant:

const struct vmobj_charset_ext_t *get_ext_ptr() const
        { return (vmobj_charset_ext_t *)ext_; }